

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Iterator * __thiscall kj::_::BTreeImpl::Iterator::operator++(Iterator *this)

{
  uint uVar1;
  Leaf *pLVar2;
  
  uVar1 = this->row + 1;
  this->row = uVar1;
  if (uVar1 < 0xe) {
    pLVar2 = this->leaf;
    if (pLVar2->rows[uVar1].i != 0) {
      return this;
    }
  }
  else {
    pLVar2 = this->leaf;
  }
  if ((ulong)pLVar2->next == 0) {
    return this;
  }
  this->leaf = (Leaf *)(this->tree + pLVar2->next);
  this->row = 0;
  return this;
}

Assistant:

inline Iterator& operator++() {
    KJ_IREQUIRE(leaf->rows[row] != nullptr, "B-tree iterator overflow");
    ++row;
    if (row >= Leaf::NROWS || leaf->rows[row] == nullptr) {
      if (leaf->next == 0) {
        // at end; stay on current leaf
      } else {
        leaf = &tree[leaf->next].leaf;
        row = 0;
      }
    }
    return *this;
  }